

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t * Acb_VerilogSimpleLex(char *pFileName,Abc_Nam_t *pNames)

{
  int Entry;
  int iVar1;
  int iVar2;
  char *pTemp;
  Vec_Int_t *p;
  int *piVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar3 = (int *)malloc(4000);
  p->pArray = piVar3;
  __s = Extra_FileReadContents(pFileName);
  sVar4 = strlen(__s);
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  pcVar5 = __s;
  do {
    if (*pcVar5 == '/') {
      if (pcVar5[1] == '/') {
        for (; (*pcVar5 != '\0' && (*pcVar5 != '\n')); pcVar5 = pcVar5 + 1) {
          *pcVar5 = ' ';
        }
      }
    }
    else if (*pcVar5 == '\0') break;
    pcVar5 = pcVar5 + 1;
  } while( true );
  pcVar5 = strtok(__s,"  \n\r\t(),;=");
  do {
    if (pcVar5 == (char *)0x0) {
      free(__s);
      return p;
    }
    iVar1 = Abc_NamStrFindOrAdd(pNames,pcVar5,(int *)0x0);
    iVar2 = strcmp(pcVar5,"assign");
    Entry = iVar1;
    if (iVar2 == 0) {
      Entry = 6;
    }
    Vec_IntPush(p,Entry);
    if (iVar1 - 6U < 8) {
      for (; ((pcVar5 < __s + sVar4 && (*pcVar5 != '\n')) && (*pcVar5 != '(')); pcVar5 = pcVar5 + 1)
      {
      }
      if (*pcVar5 != '(') goto LAB_0038fed2;
    }
    else {
LAB_0038fed2:
      pcVar5 = (char *)0x0;
    }
    pcVar5 = strtok(pcVar5,"  \n\r\t(),;=");
  } while( true );
}

Assistant:

Vec_Int_t * Acb_VerilogSimpleLex( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vBuffer = Vec_IntAlloc( 1000 );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pStart, * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    Acb_VerilogRemoveComments( pBuffer );
    pToken = strtok( pBuffer, "  \n\r\t(),;=" );
    while ( pToken )
    {
        int iToken = Abc_NamStrFindOrAdd( pNames, pToken, NULL );
        if ( !strcmp(pToken, "assign") )
            Vec_IntPush( vBuffer, ACB_BUF );
        else
            Vec_IntPush( vBuffer, iToken );
        if ( iToken >= ACB_BUF && iToken < ACB_UNUSED )
        {
            for ( pStart = pToken; pStart < pLimit && *pStart != '\n'; pStart++ )
                if ( *pStart == '(' )
                    break;
            if ( *pStart == '(' )
            {
                pToken = strtok( pStart, "  \n\r\t(),;=" );
                continue;
            }
        }
        pToken = strtok( NULL, "  \n\r\t(),;=" );
    }
    ABC_FREE( pBuffer );
    return vBuffer;
}